

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool TestHashList<Blob<224>>
               (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,bool drawDiagram,
               bool testCollision,bool testDist,bool testHighBits,bool testLowBits)

{
  pointer pBVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined7 extraout_var;
  ulong uVar9;
  byte bVar10;
  undefined7 in_register_00000009;
  long lVar11;
  undefined7 in_register_00000011;
  long lVar12;
  undefined8 unaff_R12;
  pointer pBVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  vector<Blob<224>,_std::allocator<Blob<224>_>_> revhashes;
  HashSet<Blob<224>_> collisions;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> local_c0;
  double local_a8;
  uint local_9c;
  _Rb_tree<Blob<224>,_Blob<224>,_std::_Identity<Blob<224>_>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>
  local_98;
  Blob<224> local_68;
  Blob<224> local_4c;
  
  uVar9 = CONCAT71(in_register_00000009,testDist);
  bVar2 = true;
  if ((int)CONCAT71(in_register_00000011,testCollision) != 0) {
    local_9c = (uint)uVar9;
    iVar7 = (int)((ulong)((long)(hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x49249249;
    auVar17._0_8_ = (double)iVar7;
    local_a8 = auVar17._0_8_ * (double)(iVar7 + -1);
    dVar15 = ldexp(1.0,0xe0);
    auVar16._0_8_ = local_a8 / dVar15;
    auVar16._8_8_ = 0;
    auVar17._8_8_ = 0;
    auVar16 = vminsd_avx(auVar17,auVar16);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",0xe0);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar8 = FindCollisions<Blob<224>>(hashes,(HashSet<Blob<224>_> *)&local_98,1000);
    printf("actual %6i (%.2fx)",(double)(int)uVar8 / auVar16._0_8_,(ulong)uVar8);
    uVar9 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (0 < (int)uVar8) {
      uVar9 = 0;
      printf(" !!!!!");
    }
    putchar(10);
    fflush((FILE *)0x0);
    if (testHighBits) {
      bVar2 = CountHighbitsCollisions<Blob<224>>(hashes,0xa0);
      bVar3 = CountHighbitsCollisions<Blob<224>>(hashes,0x80);
      bVar4 = CountHighbitsCollisions<Blob<224>>(hashes,0x40);
      uVar9 = CONCAT71(extraout_var,bVar4) & 0xffffffff;
      bVar4 = CountHighbitsCollisions<Blob<224>>(hashes,0x20);
      bVar5 = TestHighbitsCollisions<Blob<224>>(hashes);
      uVar9 = CONCAT71((int7)(uVar9 >> 8),
                       (byte)uVar9 & bVar4 & (bVar2 && bVar3) & bVar5 & (int)uVar8 < 1);
    }
    if (testLowBits) {
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::vector(&local_c0,hashes);
      local_a8 = (double)CONCAT44(local_a8._4_4_,(int)uVar9);
      if (local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar9 = 0;
        pBVar13 = local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        lVar12 = 0;
        uVar14 = 0;
        do {
          lVar11 = 0;
          pBVar13 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            local_68.bytes[lVar11] = pBVar13->bytes[lVar11 + lVar12];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x1c);
          bitreverse<Blob<224>>(&local_4c,&local_68,0xe0);
          lVar11 = 0;
          do {
            (local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
             super__Vector_impl_data._M_start)->bytes[lVar11 + lVar12] = local_4c.bytes[lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x1c);
          uVar14 = uVar14 + 1;
          lVar12 = lVar12 + 0x1c;
          uVar9 = ((long)local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl
                         .super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
          pBVar13 = local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (uVar14 < uVar9);
      }
      pBVar1 = local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
          super__Vector_impl_data._M_start != pBVar13) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                   super__Vector_impl_data._M_start,pBVar13,(int)LZCOUNT(uVar9) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pBVar1,pBVar13);
      }
      bVar2 = CountLowbitsCollisions<Blob<224>>(&local_c0,0xa0);
      bVar3 = CountLowbitsCollisions<Blob<224>>(&local_c0,0x80);
      bVar4 = CountLowbitsCollisions<Blob<224>>(&local_c0,0x40);
      bVar5 = CountLowbitsCollisions<Blob<224>>(&local_c0,0x20);
      bVar6 = TestLowbitsCollisions<Blob<224>>(&local_c0);
      bVar10 = SUB81(local_a8,0);
      if (local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar9 = (ulong)((bVar3 && bVar4) & bVar10 & bVar2 & (bVar5 && bVar6));
    }
    bVar2 = SUB81(uVar9,0);
    std::
    _Rb_tree<Blob<224>,_Blob<224>,_std::_Identity<Blob<224>_>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>
    ::~_Rb_tree(&local_98);
    uVar9 = (ulong)local_9c;
  }
  if ((char)uVar9 != '\0') {
    bVar3 = TestDistribution<Blob<224>>(hashes,drawDiagram);
    bVar2 = bVar2 != false && bVar3;
  }
  return bVar2;
}

Assistant:

bool TestHashList ( std::vector<hashtype> & hashes, bool drawDiagram,
                    bool testCollision = true, bool testDist = true,
                    bool testHighBits = true, bool testLowBits = true )
{
  bool result = true;

  if (testCollision)
  {
    size_t const count = hashes.size();
    double const expected = EstimateNbCollisions(count, sizeof(hashtype) * 8);
    printf("Testing collisions (%3i-bit) - Expected %6.1f, ",
           (int)sizeof(hashtype)*8, expected);

    double collcount = 0;
    HashSet<hashtype> collisions;
    collcount = FindCollisions(hashes, collisions, 1000);
    printf("actual %6i (%.2fx)", (int)collcount, collcount / expected);

    if(sizeof(hashtype) == sizeof(uint32_t))
    {
    // 2x expected collisions = fail

    // #TODO - collision failure cutoff needs to be expressed as a standard deviation instead
    // of a scale factor, otherwise we fail erroneously if there are a small expected number
    // of collisions

        if ((collcount / expected) > 2.0)
        {
          printf(" !!!!!");
          result = false;
        }
    }
    else
    {
      // For all hashes larger than 32 bits, _any_ collisions are a failure.

      if(collcount > 0)
      {
        printf(" !!!!!");
        result = false;
        //if(drawDiagram) PrintCollisions(hashes, collisions);
      }
    }

    printf("\n");
    fflush(NULL);

    if (testHighBits) {
      result &= CountHighbitsCollisions(hashes, 224);
      result &= CountHighbitsCollisions(hashes, 160);
      result &= CountHighbitsCollisions(hashes, 128);
      result &= CountHighbitsCollisions(hashes,  64);
      result &= CountHighbitsCollisions(hashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountHighbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestHighbitsCollisions(hashes);

      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountHighbitsCollisions(hashes,   12);
      //result &= CountHighbitsCollisions(hashes,   8);
    }
    if (testLowBits) {
      // reverse: bitwise flip the hashes. lowest bits first
      std::vector<hashtype> revhashes = hashes;
      for (size_t i = 0; i < revhashes.size(); i++) {
        revhashes[i] = bitreverse(hashes[i]);
      }
      std::sort(revhashes.begin(), revhashes.end());

      result &= CountLowbitsCollisions(revhashes, 224);
      result &= CountLowbitsCollisions(revhashes, 160);
      result &= CountLowbitsCollisions(revhashes, 128);
      result &= CountLowbitsCollisions(revhashes,  64);
      result &= CountLowbitsCollisions(revhashes,  32);

      /*
        int const optimalNbBits = FindNbBitsForCollisionTarget(100, count);
        result &= CountLowbitsCollisions(hashes, optimalNbBits);
      */

      result &= TestLowbitsCollisions(revhashes);
      /* Following tests are too small : tables are necessarily saturated.
       * It would be better to count the nb of collisions per Cell,
       * and compared the distribution of values against a random source.
       * But this is a different test */
      //result &= CountLowbitsCollisions(revhashes,   12);
      //result &= CountLowbitsCollisions(revhashes,   8);

      //std::vector<hashtype>().swap(revhashes);
      //revhashes.clear();
    }
  }


  //----------

  if(testDist)
  {
    result &= TestDistribution(hashes,drawDiagram);
  }

  return result;
}